

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O0

void __thiscall
unitStringDefinitions_measurementDuplicates_Test::TestBody
          (unitStringDefinitions_measurementDuplicates_Test *this)

{
  bool bVar1;
  const_iterator pvVar2;
  Message *pMVar3;
  char *message;
  char *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_bool>
  pVar4;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_bool>
  res;
  value_type *ustring;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_units::precise_unit>,_251UL> *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  testMap;
  unitStringDefinitions_measurementDuplicates_Test *this_local;
  
  testMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
         *)&__range1);
  __end1 = std::array<std::pair<const_char_*,_units::precise_unit>,_251UL>::begin
                     ((array<std::pair<const_char_*,_units::precise_unit>,_251UL> *)
                      units::defined_measurement_types);
  pvVar2 = std::array<std::pair<const_char_*,_units::precise_unit>,_251UL>::end
                     ((array<std::pair<const_char_*,_units::precise_unit>,_251UL> *)
                      units::defined_measurement_types);
  for (; __end1 != pvVar2; __end1 = __end1 + 1) {
    res._8_8_ = __end1;
    if (__end1->first != (char *)0x0) {
      pVar4 = std::
              map<std::__cxx11::string,units::precise_unit,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
              ::emplace<char_const*const&,units::precise_unit_const&>
                        ((map<std::__cxx11::string,units::precise_unit,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
                          *)&__range1,&__end1->first,&__end1->second);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )pVar4.first._M_node;
      res.first._M_node._0_1_ = pVar4.second;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_a0,(bool *)&res,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
      if (!bVar1) {
        testing::Message::Message(&local_a8);
        pMVar3 = testing::Message::operator<<
                           (&local_a8,(char (*) [35])"duplicate measurement type string ");
        pMVar3 = testing::Message::operator<<(pMVar3,(char **)res._8_8_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_d0,(internal *)local_a0,(AssertionResult *)"res.second","false","true",
                   in_R9);
        message = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_defined_units.cpp"
                   ,0x99,message);
        testing::internal::AssertHelper::operator=(&local_b0,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        testing::Message::~Message(&local_a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
          *)&__range1);
  return;
}

Assistant:

TEST(unitStringDefinitions, measurementDuplicates)
{
    std::map<std::string, units::precise_unit> testMap;
    for (const auto& ustring : units::defined_measurement_types) {
        if (ustring.first == nullptr) {
            continue;
        }
        auto res = testMap.emplace(ustring.first, ustring.second);
        EXPECT_TRUE(res.second)
            << "duplicate measurement type string " << ustring.first;
    }
}